

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

ggml_cgraph *
clip_image_build_graph
          (clip_ctx *ctx,clip_image_f32_batch *imgs,clip_image_size load_image_size,bool is_inf)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  pointer puVar6;
  __uniq_ptr_data<clip_image_f32,_clip_image_f32_deleter,_true,_true> _Var7;
  double dVar8;
  double dVar9;
  int iVar10;
  long lVar11;
  __uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true> _Var12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ggml_tensor *pos_h;
  ggml_tensor *pos_w;
  ulong uVar18;
  ggml_tensor *pgVar19;
  undefined8 uVar20;
  ggml_cgraph *pgVar21;
  undefined4 *puVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  float fVar28;
  float fVar29;
  double __x;
  undefined4 uVar30;
  ggml_context_ptr ctx0_ptr;
  ggml_cgraph *local_78;
  undefined7 uStack_3f;
  
  uVar30 = (undefined4)((uint7)uStack_3f >> 0x18);
  if (ctx->proj_type - PROJECTOR_TYPE_GEMMA3 < 2) {
    iVar26 = (ctx->vision_model).hparams.image_size;
    iVar2 = (ctx->vision_model).hparams.patch_size;
    iVar24 = (ctx->vision_model).hparams.hidden_size;
    lVar11 = (long)iVar24;
    iVar3 = (ctx->vision_model).hparams.n_head;
    lVar23 = (long)iVar3;
    if ((long)(imgs->entries).
              super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(imgs->entries).
              super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) {
      uVar13 = 0x188;
      goto LAB_0013a5a7;
    }
    uVar4 = (ctx->vision_model).hparams.n_layer;
    fVar1 = (ctx->vision_model).hparams.eps;
    _Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
    super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
         (__uniq_ptr_impl<ggml_context,_ggml_context_deleter>)
         ggml_init(ctx,imgs,(long)iVar24 % (long)iVar3 & 0xffffffff);
    ctx0_ptr._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
    super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
         (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)
         (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)
         _Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl;
    local_78 = (ggml_cgraph *)
               ggml_new_graph(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
    uVar13 = ggml_new_tensor_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0,
                                (long)iVar26,(long)iVar26,3);
    ggml_set_name(uVar13,"inp_raw");
    ggml_set_input(uVar13);
    uVar13 = ggml_conv_2d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                          (ctx->vision_model).patch_embeddings_0,uVar13,iVar2,iVar2,0,0,1,
                          CONCAT44(uVar30,1));
    iVar26 = (iVar26 / iVar2) * (iVar26 / iVar2);
    uVar13 = ggml_reshape_2d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                             super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                             super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,iVar26
                             ,lVar11);
    uVar13 = ggml_transpose(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
    uVar13 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
    uVar13 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                      (ctx->vision_model).patch_bias);
    lVar14 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                      (ctx->vision_model).position_embeddings);
    lVar15 = (long)(iVar24 / iVar3);
    fVar28 = (float)(iVar24 / iVar3);
    uVar27 = 0;
    uVar18 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar18 = uVar27;
    }
    for (; uVar18 * 0xb0 != uVar27; uVar27 = uVar27 + 0xb0) {
      uVar13 = ggml_norm(fVar1,_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar14);
      uVar13 = ggml_mul(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ln_1_w + uVar27));
      uVar13 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ln_1_b + uVar27));
      uVar16 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            *(undefined8 *)
                             ((long)&((ctx->vision_model).layers.
                                      super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->q_w + uVar27),
                            uVar13);
      uVar16 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->q_b + uVar27));
      uVar16 = ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                               lVar15,lVar23,iVar26);
      uVar16 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,0,2,1,3
                           );
      uVar16 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16);
      uVar17 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            *(undefined8 *)
                             ((long)&((ctx->vision_model).layers.
                                      super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->k_w + uVar27),
                            uVar13);
      uVar17 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->k_b + uVar27));
      uVar17 = ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17,
                               lVar15,lVar23,iVar26);
      uVar17 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17,0,2,1,3
                           );
      uVar17 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17);
      uVar13 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            *(undefined8 *)
                             ((long)&((ctx->vision_model).layers.
                                      super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->v_w + uVar27),
                            uVar13);
      uVar13 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->v_b + uVar27));
      uVar13 = ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                               lVar15,lVar23,iVar26);
      uVar13 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,1,2,0,3
                           );
      uVar13 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      uVar16 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17,uVar16)
      ;
      fVar29 = SQRT(fVar28);
      if (fVar28 < 0.0) {
        fVar29 = sqrtf(fVar28);
      }
      uVar16 = ggml_soft_max_ext(1.0 / fVar29,
                                 _Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,0)
      ;
      uVar13 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,uVar16)
      ;
      uVar13 = ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                               lVar15,iVar26,lVar23);
      uVar13 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,0,2,1,3
                           );
      uVar13 = ggml_cont_2d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,lVar11,
                            iVar26);
      uVar13 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            *(undefined8 *)
                             ((long)&((ctx->vision_model).layers.
                                      super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->o_w + uVar27),
                            uVar13);
      uVar13 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->o_b + uVar27));
      uVar13 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,lVar14);
      uVar16 = ggml_norm(fVar1,_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      uVar16 = ggml_mul(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ln_2_w + uVar27));
      uVar16 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ln_2_b + uVar27));
      uVar16 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            *(undefined8 *)
                             ((long)&((ctx->vision_model).layers.
                                      super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->ff_i_w + uVar27),
                            uVar16);
      uVar16 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ff_i_b + uVar27));
      uVar16 = ggml_gelu(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16);
      uVar16 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            *(undefined8 *)
                             ((long)&((ctx->vision_model).layers.
                                      super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->ff_o_w + uVar27),
                            uVar16);
      uVar16 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                        *(undefined8 *)
                         ((long)&((ctx->vision_model).layers.
                                  super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ff_o_b + uVar27));
      lVar14 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,uVar16);
    }
    if ((ctx->vision_model).post_ln_w != (ggml_tensor *)0x0) {
      uVar13 = ggml_norm(fVar1,_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar14);
      ggml_set_name(uVar13,"post_ln");
      uVar13 = ggml_mul(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                        (ctx->vision_model).post_ln_w);
      lVar14 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                        (ctx->vision_model).post_ln_b);
    }
    if (ctx->proj_type == PROJECTOR_TYPE_IDEFICS3) {
      iVar26 = (ctx->vision_model).hparams.proj_scale_factor;
      uVar13 = *(undefined8 *)(lVar14 + 0x10);
      iVar2 = *(int *)(lVar14 + 0x18);
      __x = (double)iVar2;
      dVar8 = SQRT(__x);
      dVar9 = dVar8;
      if (__x < 0.0) {
        dVar9 = sqrt(__x);
        dVar8 = sqrt(__x);
      }
      if (iVar26 == 0) goto LAB_0013a5c8;
      iVar24 = (int)uVar13 * iVar26;
      uVar13 = ggml_reshape_4d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar14,
                               (long)iVar24,(long)((int)dVar8 / iVar26),(long)(int)dVar9,1);
      uVar13 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,0,2,1,3
                           );
      uVar13 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      lVar11 = (long)(iVar24 * iVar26);
      uVar13 = ggml_reshape_4d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                               lVar11,(long)((int)dVar9 / iVar26),(long)((int)dVar8 / iVar26),1);
      uVar13 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,0,2,1,3
                           );
      uVar13 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      uVar13 = ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                               lVar11,(long)(iVar2 / (iVar26 * iVar26)),1);
      uVar13 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            (ctx->vision_model).projection,uVar13);
LAB_0013a543:
      ggml_build_forward_expand(local_78,uVar13);
LAB_0013a550:
      std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&ctx0_ptr);
      return local_78;
    }
    if (ctx->proj_type == PROJECTOR_TYPE_GEMMA3) {
      iVar26 = (int)SQRT((double)iVar26);
      uVar18 = (long)iVar26 / 0x10;
      uVar13 = ggml_transpose(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar14,
                              (long)iVar26 % 0x10 & 0xffffffff);
      uVar13 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      uVar13 = ggml_reshape_4d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                               (long)iVar26,(long)iVar26,lVar11,1);
      lVar23 = ggml_pool_2d(0,0,_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,1,
                            uVar18 & 0xffffffff,uVar18 & 0xffffffff,uVar18 & 0xffffffff,(int)uVar18)
      ;
      uVar13 = ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar23,
                               *(long *)(lVar23 + 0x10) * *(long *)(lVar23 + 0x10),lVar11,1);
      uVar13 = ggml_transpose(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      uVar13 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      uVar13 = ggml_rms_norm(fVar1,_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                   _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                   .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13
                            );
      uVar13 = ggml_mul(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                        (ctx->vision_model).mm_soft_emb_norm_w);
      uVar16 = ggml_transpose(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              (ctx->vision_model).mm_input_proj_w);
      uVar16 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16);
      uVar13 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,uVar13)
      ;
      goto LAB_0013a543;
    }
  }
  else {
    if (ctx->proj_type != PROJECTOR_TYPE_PIXTRAL) {
      pgVar21 = clip_image_build_graph_legacy(ctx,imgs,load_image_size,is_inf);
      return pgVar21;
    }
    puVar6 = (imgs->entries).
             super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(imgs->entries).
              super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 == 8) {
      _Var7.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
      super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
      super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl =
           (puVar6->_M_t).super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>;
      iVar26 = *(int *)_Var7.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
                       super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                       super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl;
      iVar2 = *(int *)((long)_Var7.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>.
                             _M_t.super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                             super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl + 4);
      iVar24 = (ctx->vision_model).hparams.patch_size;
      uVar4 = (ctx->vision_model).hparams.n_layer;
      iVar10 = iVar26 / iVar24;
      iVar25 = iVar2 / iVar24;
      iVar3 = (ctx->vision_model).hparams.hidden_size;
      iVar5 = (ctx->vision_model).hparams.n_head;
      lVar15 = (long)iVar5;
      fVar1 = (ctx->vision_model).hparams.eps;
      _Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
           (__uniq_ptr_impl<ggml_context,_ggml_context_deleter>)
           ggml_init(ctx,lVar15,(long)iVar3 % (long)iVar5 & 0xffffffff);
      ctx0_ptr._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
           (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)
           (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)
           _Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl;
      local_78 = (ggml_cgraph *)
                 ggml_new_graph(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
      uVar13 = ggml_new_tensor_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                  _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0,
                                  (long)iVar26,(long)iVar2,3);
      ggml_set_name(uVar13,"inp_raw");
      ggml_set_input(uVar13);
      iVar26 = iVar25 * iVar10;
      lVar23 = (long)iVar26;
      pos_h = (ggml_tensor *)
              ggml_new_tensor_1d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0x1a);
      ggml_set_name(pos_h,"pos_h");
      ggml_set_input(pos_h);
      pos_w = (ggml_tensor *)
              ggml_new_tensor_1d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0x1a,
                                 lVar23);
      ggml_set_name(pos_w,"pos_w");
      ggml_set_input(pos_w);
      uVar13 = ggml_conv_2d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            (ctx->vision_model).patch_embeddings_0,uVar13,iVar24,iVar24,0,0,1,
                            CONCAT44(uVar30,1));
      uVar13 = ggml_reshape_2d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                               lVar23,(long)iVar3);
      uVar13 = ggml_transpose(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      uVar13 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      uVar13 = ggml_rms_norm(fVar1,_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                   _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                   .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13
                            );
      uVar13 = ggml_mul(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                        (ctx->vision_model).pre_ln_w);
      lVar11 = (long)(iVar3 / iVar5);
      fVar28 = (float)(iVar3 / iVar5);
      uVar27 = 0;
      uVar18 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar18 = uVar27;
      }
      for (; uVar18 * 0xb0 != uVar27; uVar27 = uVar27 + 0xb0) {
        uVar16 = ggml_rms_norm(fVar1,_Var12.
                                     super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                     super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                     super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                               uVar13);
        uVar16 = ggml_mul(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ln_1_w + uVar27));
        uVar17 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->q_w + uVar27),
                              uVar16);
        pgVar19 = (ggml_tensor *)
                  ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                  _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17,
                                  lVar11,lVar15,lVar23);
        pgVar19 = build_rope_2d((ggml_context *)
                                _Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar19,
                                pos_h,pos_w,(ctx->vision_model).hparams.rope_theta);
        uVar17 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar19,0,2,
                              1,3);
        uVar17 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17);
        uVar20 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->k_w + uVar27),
                              uVar16);
        pgVar19 = (ggml_tensor *)
                  ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                  _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar20,
                                  lVar11,lVar15,lVar23);
        pgVar19 = build_rope_2d((ggml_context *)
                                _Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar19,
                                pos_h,pos_w,(ctx->vision_model).hparams.rope_theta);
        uVar20 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar19,0,2,
                              1,3);
        uVar20 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar20);
        uVar16 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->v_w + uVar27),
                              uVar16);
        uVar16 = ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                                 lVar11,lVar15,lVar23);
        uVar16 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,1,2,0
                              ,3);
        uVar16 = ggml_cont(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16);
        uVar17 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar20,
                              uVar17);
        fVar29 = SQRT(fVar28);
        if (fVar28 < 0.0) {
          fVar29 = sqrtf(fVar28);
        }
        uVar17 = ggml_soft_max_ext(1.0 / fVar29,0,
                                   _Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                   _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                   .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17
                                   ,0);
        uVar16 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                              uVar17);
        uVar16 = ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                                 lVar11,lVar23,lVar15);
        uVar16 = ggml_permute(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,0,2,1
                             );
        uVar16 = ggml_cont_2d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                              (long)iVar3,lVar23);
        uVar16 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->o_w + uVar27),
                              uVar16);
        uVar13 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,uVar13);
        uVar16 = ggml_rms_norm(fVar1,_Var12.
                                     super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                     super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                     super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                               uVar13);
        uVar16 = ggml_mul(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                          *(undefined8 *)
                           ((long)&((ctx->vision_model).layers.
                                    super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ln_2_w + uVar27));
        uVar17 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->ff_gate_w +
                               uVar27),uVar16);
        uVar16 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->ff_up_w + uVar27)
                              ,uVar16);
        uVar17 = ggml_silu(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar17);
        uVar16 = ggml_mul(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,uVar17);
        uVar16 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                              *(undefined8 *)
                               ((long)&((ctx->vision_model).layers.
                                        super__Vector_base<clip_layer,_std::allocator<clip_layer>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->ff_down_w +
                               uVar27),uVar16);
        uVar13 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,uVar16);
      }
      uVar13 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            (ctx->vision_model).mm_1_w,uVar13);
      uVar13 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                        (ctx->vision_model).mm_1_b);
      uVar13 = ggml_gelu(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13);
      uVar13 = ggml_mul_mat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                            (ctx->vision_model).mm_2_w,uVar13);
      puVar22 = (undefined4 *)
                ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,
                         (ctx->vision_model).mm_2_b);
      lVar11 = (long)(int)puVar22[4];
      uVar13 = ggml_reshape_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                               .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,puVar22,
                               lVar11,(long)iVar10,(long)iVar25);
      uVar16 = ggml_new_tensor_3d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                  _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,*puVar22
                                  ,lVar11,1,(long)iVar25);
      uVar16 = ggml_scale(0,_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16);
      uVar16 = ggml_add(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar16,
                        (ctx->vision_model).token_embd_img_break);
      puVar22 = (undefined4 *)
                ggml_concat(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar13,uVar16,
                            1);
      uVar13 = ggml_row_size(*puVar22,lVar11);
      uVar13 = ggml_view_2d(_Var12.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                            super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,puVar22,lVar11
                            ,(long)(iVar25 + iVar26 + -1),uVar13,0);
      ggml_build_forward_expand(local_78,uVar13);
      goto LAB_0013a550;
    }
    uVar13 = 0x275;
LAB_0013a5a7:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
               ,uVar13,"GGML_ASSERT(%s) failed","imgs.entries.size() == 1");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
             ,0x223,"SigLIP: Unsupported projector type");
LAB_0013a5c8:
  uVar13 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                      ,0x212,"GGML_ASSERT(%s) failed","scale_factor != 0");
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&ctx0_ptr);
  _Unwind_Resume(uVar13);
}

Assistant:

static ggml_cgraph * clip_image_build_graph(clip_ctx * ctx, const clip_image_f32_batch & imgs, struct clip_image_size load_image_size, bool is_inf = false) {
    ggml_cgraph * res;
    switch (ctx->proj_type) {
        case PROJECTOR_TYPE_GEMMA3:
        case PROJECTOR_TYPE_IDEFICS3:
            {
                res = clip_image_build_graph_siglip(ctx, imgs);
            } break;
        case PROJECTOR_TYPE_PIXTRAL:
            {
                res = clip_image_build_graph_pixtral(ctx, imgs);
            } break;
        default:
            {
                // TODO: we should have one build_* function per model
                res = clip_image_build_graph_legacy(ctx, imgs, load_image_size, is_inf);
            } break;
    }
    return res;
}